

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsSetUploadCounter(Curl_easy *data,curl_off_t size)

{
  long lVar1;
  timeval now_00;
  __time_t local_28;
  timeval now;
  curl_off_t size_local;
  Curl_easy *data_local;
  
  now_00 = curlx_tvnow();
  (data->progress).uploaded = size;
  if (0 < (data->set).max_send_speed) {
    local_28 = now_00.tv_sec;
    now.tv_sec = now_00.tv_usec;
    lVar1 = Curl_pgrsLimitWaitTime
                      ((data->progress).uploaded,(data->progress).ul_limit_size,
                       (data->set).max_send_speed,(data->progress).ul_limit_start,now_00);
    if (lVar1 == 0) {
      (data->progress).ul_limit_start.tv_sec = local_28;
      (data->progress).ul_limit_start.tv_usec = now.tv_sec;
      (data->progress).ul_limit_size = size;
    }
  }
  return;
}

Assistant:

void Curl_pgrsSetUploadCounter(struct Curl_easy *data, curl_off_t size)
{
  struct timeval now = Curl_tvnow();

  data->progress.uploaded = size;

  /* upload speed limit */
  if((data->set.max_send_speed > 0) &&
     (Curl_pgrsLimitWaitTime(data->progress.uploaded,
                             data->progress.ul_limit_size,
                             data->set.max_send_speed,
                             data->progress.ul_limit_start,
                             now) == 0)) {
    data->progress.ul_limit_start = now;
    data->progress.ul_limit_size = size;
  }
}